

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O2

void __thiscall CommandDrawString::SetStringToTag(CommandDrawString *this,AActor *actor)

{
  PClass *pPVar1;
  char *copyStr;
  
  if (actor == (AActor *)0x0) {
    this->cache = -1;
    FString::operator=(&this->str,(char *)"");
    return;
  }
  pPVar1 = DObject::GetClass((DObject *)actor);
  if ((PClass *)this->cache == pPVar1) {
    return;
  }
  pPVar1 = DObject::GetClass((DObject *)actor);
  this->cache = (intptr_t)pPVar1;
  copyStr = AActor::GetTag(actor,(char *)0x0);
  FString::operator=(&this->str,copyStr);
  RealignString(this);
  return;
}

Assistant:

void SetStringToTag(AActor *actor)
		{
			if (actor != NULL)
			{
				if ((intptr_t)actor->GetClass() != cache)
				{
					cache = (intptr_t)actor->GetClass();
					str = actor->GetTag();
					RealignString();
				}
			}
			else
			{
				cache = -1;
				str = "";
			}
		}